

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cpp
# Opt level: O1

void __thiscall RPCClient::_DoConnect(RPCClient *this,Handle *handle,uint32_t err)

{
  element_type *peVar1;
  SingletonLogger *this_00;
  
  if (err != 0) {
    this_00 = cppnet::Singleton<cppnet::SingletonLogger>::Instance();
    cppnet::SingletonLogger::Error
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/test/rpc/rpc_client.cpp"
               ,0x59,"connect failed! err : %d",(ulong)err);
    return;
  }
  (this->_socket).super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_socket).super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            );
  this->_connected = true;
  peVar1 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_CNSocket[5])(peVar1,"\r\n\r\n",4);
  return;
}

Assistant:

void RPCClient::_DoConnect(cppnet::Handle handle, uint32_t err) {
    if (err != cppnet::CEC_SUCCESS) {
        cppnet::LOG_ERROR("connect failed! err : %d", err);
        return;
    }
    _socket = handle;
    _connected = true;
    handle->Write("\r\n\r\n", strlen("\r\n\r\n"));
}